

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::convertFromZeroExtendedInteger
          (IEEEFloat *this,integerPart *parts,uint width,bool isSigned,roundingMode rounding_mode)

{
  int iVar1;
  opStatus oVar2;
  undefined7 in_register_00000009;
  anon_union_8_2_1313ab2f_for_U src;
  uint srcCount;
  ArrayRef<unsigned_long> bigVal;
  APInt api;
  anon_union_8_2_1313ab2f_for_U local_68;
  uint local_60;
  roundingMode local_54;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  srcCount = width + 0x3f >> 6;
  bigVal.Length._0_4_ = srcCount;
  bigVal.Data = parts;
  bigVal.Length._4_4_ = 0;
  local_54 = rounding_mode;
  APInt::APInt((APInt *)&local_68,width,bigVal);
  this->field_0x12 = this->field_0x12 & 0xf7;
  if ((int)CONCAT71(in_register_00000009,isSigned) != 0) {
    iVar1 = APInt::tcExtractBit(parts,width - 1);
    if (iVar1 != 0) {
      this->field_0x12 = this->field_0x12 | 8;
      local_48 = local_60;
      if (local_60 < 0x41) {
        local_50.VAL = local_68.VAL;
      }
      else {
        APInt::initSlowCase((APInt *)&local_50,(APInt *)&local_68);
      }
      APInt::flipAllBits((APInt *)&local_50);
      APInt::operator++((APInt *)&local_50);
      local_38 = local_48;
      local_40.VAL = local_50.VAL;
      local_48 = 0;
      APInt::operator=((APInt *)&local_68,(APInt *)&local_40);
      if ((0x40 < local_38) && ((integerPart *)local_40.VAL != (integerPart *)0x0)) {
        operator_delete__(local_40.pVal);
      }
      if ((0x40 < local_48) && ((integerPart *)local_50.VAL != (integerPart *)0x0)) {
        operator_delete__(local_50.pVal);
      }
    }
  }
  src.pVal = (uint64_t *)&local_68;
  if (0x40 < local_60) {
    src = local_68;
  }
  oVar2 = convertFromUnsignedParts(this,src.pVal,srcCount,local_54);
  if ((0x40 < local_60) && ((integerPart *)local_68.VAL != (integerPart *)0x0)) {
    operator_delete__(local_68.pVal);
  }
  return oVar2;
}

Assistant:

IEEEFloat::opStatus
IEEEFloat::convertFromZeroExtendedInteger(const integerPart *parts,
                                          unsigned int width, bool isSigned,
                                          roundingMode rounding_mode) {
  unsigned int partCount = partCountForBits(width);
  APInt api = APInt(width, makeArrayRef(parts, partCount));

  sign = false;
  if (isSigned && APInt::tcExtractBit(parts, width - 1)) {
    sign = true;
    api = -api;
  }

  return convertFromUnsignedParts(api.getRawData(), partCount, rounding_mode);
}